

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O2

bool getLine(char *buff,int *buff_p,string *line)

{
  char cVar1;
  long lVar2;
  char cVar3;
  
  std::__cxx11::string::assign((char *)line);
  lVar2 = (long)*buff_p;
  cVar1 = buff[lVar2];
  cVar3 = cVar1;
  if (cVar1 != '\0') {
    while (cVar3 != '\n') {
      *buff_p = (int)lVar2 + 1;
      std::__cxx11::string::push_back((char)line);
      lVar2 = (long)*buff_p;
      cVar3 = buff[lVar2];
    }
    *buff_p = (int)lVar2 + 1;
  }
  return cVar1 != '\0';
}

Assistant:

bool getLine(char* buff, int& buff_p, string& line){
    line = "";
    if(buff[buff_p] == 0) return false;
    while(buff[buff_p] != '\n'){
        line += buff[buff_p++];
    }
    buff_p++;
    return true;
}